

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool ssh1_common_filter_queue(PacketProtocolLayer *ppl)

{
  int iVar1;
  Ssh *ssh;
  LogContext *ctx;
  uint uVar2;
  PktIn *pPVar3;
  char *event;
  ptrlen pVar4;
  void *local_50;
  size_t local_48;
  void *local_40;
  size_t local_38;
  ptrlen msg;
  PktIn *pktin;
  PacketProtocolLayer *ppl_local;
  
  while( true ) {
    pPVar3 = (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,false);
    if (pPVar3 == (PktIn *)0x0) {
      return false;
    }
    iVar1 = pPVar3->type;
    if (iVar1 == 1) break;
    if (iVar1 == 0x20) {
      (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,true);
    }
    else {
      if (iVar1 != 0x24) {
        return false;
      }
      pVar4 = BinarySource_get_string(pPVar3->binarysource_);
      local_50 = pVar4.ptr;
      local_48 = pVar4.len;
      ctx = ppl->logctx;
      uVar2 = string_length_for_printf(local_48);
      event = dupprintf("Remote debug message: %.*s",(ulong)uVar2,local_50);
      logevent_and_free(ctx,event);
      (*ppl->in_pq->after)(&ppl->in_pq->pqb,(PacketQueueNode *)ppl->in_pq,true);
    }
  }
  pVar4 = BinarySource_get_string(pPVar3->binarysource_);
  local_40 = pVar4.ptr;
  local_38 = pVar4.len;
  ssh = ppl->ssh;
  uVar2 = string_length_for_printf(local_38);
  ssh_remote_error(ssh,"Remote side sent disconnect message:\n\"%.*s\"",(ulong)uVar2,local_40);
  return true;
}

Assistant:

bool ssh1_common_filter_queue(PacketProtocolLayer *ppl)
{
    PktIn *pktin;
    ptrlen msg;

    while ((pktin = pq_peek(ppl->in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH1_MSG_DISCONNECT:
            msg = get_string(pktin);
            ssh_remote_error(ppl->ssh,
                             "Remote side sent disconnect message:\n\"%.*s\"",
                             PTRLEN_PRINTF(msg));
            /* don't try to pop the queue, because we've been freed! */
            return true;               /* indicate that we've been freed */

          case SSH1_MSG_DEBUG:
            msg = get_string(pktin);
            ppl_logevent("Remote debug message: %.*s", PTRLEN_PRINTF(msg));
            pq_pop(ppl->in_pq);
            break;

          case SSH1_MSG_IGNORE:
            /* Do nothing, because we're ignoring it! Duhh. */
            pq_pop(ppl->in_pq);
            break;

          default:
            return false;
        }
    }

    return false;
}